

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleBenchmark.cpp
# Opt level: O2

int * beagle::benchmark::getRandomTipStates(int nsites,int stateCount,uint *seed)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = (int *)calloc(4,(long)nsites);
  for (uVar3 = 0; (uint)(~(nsites >> 0x1f) & nsites) != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = *seed * 0x41c64e6d + 0x3039;
    *seed = uVar1;
    piVar2[uVar3] = (int)((long)(ulong)(uVar1 & 0x7fffffff) % (long)stateCount);
  }
  return piVar2;
}

Assistant:

int* getRandomTipStates( int nsites, int stateCount, unsigned int *seed )
{
    int *states = (int*) calloc(sizeof(int), nsites);
    for( int i=0; i<nsites; i++ )
    {
        int s = gt_rand(seed)%stateCount;
        states[i]=s;
    }
    return states;
}